

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StartsWithTestTest.cpp
# Opt level: O2

void __thiscall StartsWithTestTest::StartsWithTestTest(StartsWithTestTest *this)

{
  _Head_base<0UL,_const_oout::Test_*,_false> _Var1;
  unique_ptr<TestText,_std::default_delete<TestText>_> uStack_48;
  unique_ptr<oout::StartsWithTest,_std::default_delete<oout::StartsWithTest>_> local_40;
  unique_ptr<TestText,_std::default_delete<TestText>_> local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  char local_28 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  _Head_base<0UL,_const_oout::Test_*,_false> local_18;
  
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__StartsWithTestTest_001ccb18;
  std::make_unique<oout::StartsWithTest,char_const(&)[7],char_const(&)[4]>
            ((char (*) [7])&local_40,(char (*) [4])"abcdef");
  std::
  make_unique<TestText,std::unique_ptr<oout::StartsWithTest,std::default_delete<oout::StartsWithTest>>>
            ((unique_ptr<oout::StartsWithTest,_std::default_delete<oout::StartsWithTest>_> *)
             &uStack_48);
  std::
  make_shared<oout::EqualTest,std::unique_ptr<TestText,std::default_delete<TestText>>,char_const(&)[8]>
            (&local_38,(char (*) [8])&uStack_48);
  std::make_shared<oout::NamedTest_const,char_const(&)[18],std::shared_ptr<oout::EqualTest>>
            ((char (*) [18])local_28,(shared_ptr<oout::EqualTest> *)"Realy starts with");
  std::make_unique<oout::NamedTest,char_const(&)[19],std::shared_ptr<oout::NamedTest_const>>
            ((char (*) [19])&local_18,(shared_ptr<const_oout::NamedTest> *)"StartsWithTestTest");
  _Var1._M_head_impl = local_18._M_head_impl;
  local_18._M_head_impl = (Test *)0x0;
  (this->tests)._M_t.super___uniq_ptr_impl<const_oout::Test,_std::default_delete<const_oout::Test>_>
  ._M_t.super__Tuple_impl<0UL,_const_oout::Test_*,_std::default_delete<const_oout::Test>_>.
  super__Head_base<0UL,_const_oout::Test_*,_false>._M_head_impl = _Var1._M_head_impl;
  std::unique_ptr<oout::NamedTest,_std::default_delete<oout::NamedTest>_>::~unique_ptr
            ((unique_ptr<oout::NamedTest,_std::default_delete<oout::NamedTest>_> *)&local_18);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30);
  std::unique_ptr<TestText,_std::default_delete<TestText>_>::~unique_ptr(&uStack_48);
  std::unique_ptr<oout::StartsWithTest,_std::default_delete<oout::StartsWithTest>_>::~unique_ptr
            (&local_40);
  return;
}

Assistant:

StartsWithTestTest::StartsWithTestTest()
	: tests(
		make_unique<NamedTest>(
			"StartsWithTestTest",
			make_shared<const NamedTest>(
				"Realy starts with",
				make_shared<EqualTest>(
					make_unique<TestText>(
						make_unique<StartsWithTest>(
							"abcdef",
							"abc"
						)
					),
					"success"
				)
			)
		)
	)
{
}